

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O3

size_t read_line(int socket,dino_string_ptr *string_buffer_ptr)

{
  void *__buf;
  char ch;
  ulong in_RAX;
  dino_string_ptr pdVar1;
  ssize_t sVar2;
  size_t sVar3;
  undefined8 uStack_28;
  char c;
  
  if (string_buffer_ptr == (dino_string_ptr *)0x0) {
    return 0;
  }
  uStack_28 = in_RAX;
  if (*string_buffer_ptr == (dino_string_ptr)0x0) {
    pdVar1 = dino_string_new();
    *string_buffer_ptr = pdVar1;
  }
  else {
    dino_string_reset(*string_buffer_ptr);
  }
  __buf = (void *)((long)&uStack_28 + 7);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  do {
    sVar2 = recv(socket,__buf,1,0);
    if (sVar2 < 1) {
      uStack_28 = CONCAT17(10,(undefined7)uStack_28);
      break;
    }
    ch = uStack_28._7_1_;
    if (uStack_28._7_1_ == '\r') {
      sVar2 = recv(socket,__buf,1,2);
      if ((sVar2 < 1) || (uStack_28._7_1_ != '\n')) {
        uStack_28 = CONCAT17(10,(undefined7)uStack_28);
        ch = '\n';
      }
      else {
        recv(socket,__buf,1,0);
        ch = uStack_28._7_1_;
      }
    }
    dino_string_append_char(*string_buffer_ptr,ch);
  } while (uStack_28._7_1_ != '\n');
  sVar3 = dino_string_c_strlen(*string_buffer_ptr);
  return sVar3;
}

Assistant:

size_t read_line(int socket, dino_string_ptr *string_buffer_ptr) {

    // If input is invalid then just error out.
    //
    if (NULL == string_buffer_ptr) {
        return 0;
    }

    // We are getting a new "line" so wack the old one if it exists.
    //
    if (*string_buffer_ptr) {
        dino_string_reset(*string_buffer_ptr);
    } else {
        *string_buffer_ptr = dino_string_new();
    }

    // Now we read in the data:
    //
    char c = '\0';

    while (c != '\n') {
        ssize_t n = recv(socket, &c, 1, 0);

        if (n > 0) {
            if (c == '\r') {
                n = recv(socket, &c, 1, MSG_PEEK);

                if ((n > 0) && (c == '\n')) {
                    recv(socket, &c, 1, 0);
                } else {
                    c = '\n';
                }
            }

            dino_string_append_char(*string_buffer_ptr, c);
        } else {
            c = '\n';
        }
    }

    return dino_string_c_strlen(*string_buffer_ptr);
}